

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall
Search::predictor::add_to<float>
          (predictor *this,v_array<float> *A,bool *A_is_ptr,float *a,size_t count,bool clear_first)

{
  float **ppfVar1;
  float *in_RCX;
  byte *in_RDX;
  v_array<float> *in_RSI;
  predictor *in_RDI;
  long in_R8;
  byte in_R9B;
  size_t new_size;
  size_t old_size;
  v_array<float> *in_stack_ffffffffffffffa0;
  float *pfVar2;
  float *in_stack_ffffffffffffffa8;
  v_array<float> *in_stack_ffffffffffffffb0;
  size_t local_38;
  
  local_38 = v_array<float>::size(in_RSI);
  if (local_38 == 0) {
    if ((*in_RDX & 1) == 0) {
      v_array<float>::delete_v(in_stack_ffffffffffffffa0);
    }
    pfVar2 = in_RCX;
    ppfVar1 = v_array<float>::begin(in_RSI);
    *ppfVar1 = pfVar2;
    if (in_RCX == (float *)0x0) {
      ppfVar1 = v_array<float>::end(in_RSI);
      *ppfVar1 = (float *)0x0;
    }
    else {
      pfVar2 = in_RCX + in_R8;
      ppfVar1 = v_array<float>::end(in_RSI);
      *ppfVar1 = pfVar2;
    }
    ppfVar1 = v_array<float>::end(in_RSI);
    in_RSI->end_array = *ppfVar1;
    *in_RDX = 1;
  }
  else if ((*in_RDX & 1) == 0) {
    if ((in_R9B & 1) != 0) {
      v_array<float>::clear(in_stack_ffffffffffffffa0);
    }
    if (in_RCX != (float *)0x0) {
      push_many<float>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                       (size_t)in_stack_ffffffffffffffa0);
    }
  }
  else {
    if ((in_R9B & 1) != 0) {
      ppfVar1 = v_array<float>::begin(in_RSI);
      in_stack_ffffffffffffffb0 = (v_array<float> *)*ppfVar1;
      ppfVar1 = v_array<float>::end(in_RSI);
      *ppfVar1 = (float *)in_stack_ffffffffffffffb0;
      local_38 = 0;
    }
    make_new_pointer<float>
              ((predictor *)(local_38 + in_R8),(v_array<float> *)in_RDI,
               (size_t)in_stack_ffffffffffffffb0);
    *in_RDX = 0;
    if (in_RCX != (float *)0x0) {
      ppfVar1 = v_array<float>::begin(in_RSI);
      memcpy(*ppfVar1 + local_38,in_RCX,in_R8 << 2);
    }
  }
  return in_RDI;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T* a, size_t count, bool clear_first)
{
  size_t old_size = A.size();
  if (old_size > 0)
  {
    if (A_is_ptr)  // we need to make our own memory
    {
      if (clear_first)
      {
        A.end() = A.begin();
        old_size = 0;
      }
      size_t new_size = old_size + count;
      make_new_pointer<T>(A, new_size);
      A_is_ptr = false;
      if (a != nullptr)
        memcpy(A.begin() + old_size, a, count * sizeof(T));
    }
    else  // we already have our own memory
    {
      if (clear_first)
        A.clear();
      if (a != nullptr)
        push_many<T>(A, a, count);
    }
  }
  else  // old_size == 0, clear_first is irrelevant
  {
    if (!A_is_ptr)
      A.delete_v();  // avoid memory leak

    A.begin() = a;
    if (a != nullptr)  // a is not nullptr
      A.end() = a + count;
    else
      A.end() = a;
    A.end_array = A.end();
    A_is_ptr = true;
  }
  return *this;
}